

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSocket.cpp
# Opt level: O2

bool __thiscall Scs::Socket::Connect(Socket *this)

{
  int iVar1;
  addrinfo *paVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  
  if (this->m_socket == -1) {
    bVar5 = false;
    LogWriteLine("Invalid socket");
  }
  else {
    paVar2 = ((this->m_address).super___shared_ptr<Scs::Address,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_current;
    iVar3 = connect(this->m_socket,(sockaddr *)paVar2->ai_addr,paVar2->ai_addrlen);
    bVar5 = true;
    if (iVar3 != 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      if (((iVar3 == -1) && (bVar5 = iVar1 == 0xb || iVar1 == 0x73, iVar1 != 0xb)) &&
         (iVar1 != 0x73)) {
        LogWriteLine("Socket connect failed: %d");
      }
    }
  }
  return bVar5;
}

Assistant:

bool Socket::Connect()
{
	if (m_socket == INVALID_SOCKET)
	{
		LogWriteLine("Invalid socket");
		return false;
	}

	// Connect to server.
	addrinfo * addr = m_address->GetCurrent();
	int result = connect(m_socket, addr->ai_addr, (int)addr->ai_addrlen);
	if (result == 0)
		return true;
	int lastError = SocketLastError;
	if (result == SOCKET_ERROR && lastError != SCS_EWOULDBLOCK && lastError != EAGAIN && lastError != SCS_EINPROGRESS)
	{
		LogWriteLine("Socket connect failed: %d", lastError);
		return false;
	}
	return true;
}